

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypeCheckerTester.cpp
# Opt level: O2

void __thiscall psy::C::TypeCheckerTester::case0039(TypeCheckerTester *this)

{
  allocator<char> local_e1;
  string local_e0;
  Expectation local_c0;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_e0,
             "\nstruct s {\n    struct {\n        struct {\n            const int m ;\n        } ;\n    } ;\n    const double n ;\n} ;\nvoid _ ()\n{\n    struct s x ;\n    x . n ;\n}\n"
             ,&local_e1);
  Expectation::Expectation(&local_c0);
  checkTypes(this,&local_e0,&local_c0);
  Expectation::~Expectation(&local_c0);
  std::__cxx11::string::~string((string *)&local_e0);
  return;
}

Assistant:

void TypeCheckerTester::case0039()
{
    auto s = R"(
struct s {
    struct {
        struct {
            const int m ;
        } ;
    } ;
    const double n ;
} ;
void _ ()
{
    struct s x ;
    x . n ;
}
)";

    checkTypes(s, Expectation());
}